

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validity_mask.cpp
# Opt level: O2

string * __thiscall
duckdb::ValidityMask::ToString_abi_cxx11_
          (string *__return_storage_ptr__,ValidityMask *this,idx_t count)

{
  idx_t i;
  idx_t row_idx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ::std::__cxx11::to_string(&local_50,count);
  ::std::operator+(&local_70,"Validity Mask (",&local_50);
  ::std::operator+(__return_storage_ptr__,&local_70,") [");
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  for (row_idx = 0; count != row_idx; row_idx = row_idx + 1) {
    TemplatedValidityMask<unsigned_long>::RowIsValid
              (&this->super_TemplatedValidityMask<unsigned_long>,row_idx);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string ValidityMask::ToString(idx_t count) const {
	string result = "Validity Mask (" + to_string(count) + ") [";
	for (idx_t i = 0; i < count; i++) {
		result += RowIsValid(i) ? "." : "X";
	}
	result += "]";
	return result;
}